

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_connection.c
# Opt level: O1

ngx_int_t ngx_set_inherited_sockets(ngx_cycle_t *cycle)

{
  socklen_t *__len;
  short sVar1;
  uint uVar2;
  int iVar3;
  sockaddr *__addr;
  undefined8 uVar4;
  u_char *text;
  int *piVar5;
  char *fmt;
  ulong uVar6;
  ngx_log_t *pnVar7;
  size_t sVar8;
  undefined4 *__optval;
  int local_4c;
  undefined4 *puStack_48;
  int reuseport;
  ngx_cycle_t *local_40;
  socklen_t local_34 [2];
  socklen_t olen;
  
  if ((cycle->listening).nelts != 0) {
    __optval = (undefined4 *)((long)(cycle->listening).elts + 0xdc);
    uVar6 = 0;
    local_40 = cycle;
    do {
      __addr = (sockaddr *)ngx_palloc(cycle->pool,0x70);
      *(sockaddr **)(__optval + -0x35) = __addr;
      if (__addr == (sockaddr *)0x0) {
        return -1;
      }
      __len = __optval + -0x33;
      __optval[-0x33] = 0x70;
      iVar3 = getsockname(__optval[-0x37],__addr,__len);
      if (iVar3 == -1) {
        pnVar7 = cycle->log;
        if (2 < pnVar7->log_level) {
          piVar5 = __errno_location();
          iVar3 = *piVar5;
          uVar2 = __optval[-0x37];
          fmt = "getsockname() of the inherited socket #%d failed";
LAB_0011fef9:
          ngx_log_error_core(3,pnVar7,iVar3,fmt,(ulong)uVar2);
        }
LAB_0011ff00:
        *(byte *)(__optval + -1) = *(byte *)(__optval + -1) | 4;
      }
      else {
        if (0x70 < *__len) {
          *__len = 0x70;
        }
        sVar1 = **(short **)(__optval + -0x35);
        if (sVar1 == 10) {
          sVar8 = 0x35;
          uVar4 = 0x2d;
        }
        else if (sVar1 == 2) {
          sVar8 = 0x15;
          uVar4 = 0xf;
        }
        else {
          if (sVar1 != 1) {
            pnVar7 = cycle->log;
            if (2 < pnVar7->log_level) {
              piVar5 = __errno_location();
              iVar3 = *piVar5;
              uVar2 = __optval[-0x37];
              fmt = "the inherited socket #%d has an unsupported protocol family";
              goto LAB_0011fef9;
            }
            goto LAB_0011ff00;
          }
          uVar4 = 0x71;
          sVar8 = 0x71;
        }
        *(undefined8 *)(__optval + -0x31) = uVar4;
        text = (u_char *)ngx_pnalloc(local_40->pool,sVar8);
        *(u_char **)(__optval + -0x2d) = text;
        if (text == (u_char *)0x0) {
          return -1;
        }
        sVar8 = ngx_sock_ntop(*(sockaddr **)(__optval + -0x35),__optval[-0x33],text,sVar8,1);
        if (sVar8 == 0) {
          return -1;
        }
        puStack_48 = __optval + -0x2f;
        *(size_t *)(__optval + -0x2f) = sVar8;
        __optval[-0x2a] = 0x1ff;
        local_34[0] = 4;
        iVar3 = getsockopt(__optval[-0x37],1,3,__optval + -0x2b,local_34);
        cycle = local_40;
        if (iVar3 == -1) {
          pnVar7 = local_40->log;
          if (2 < pnVar7->log_level) {
            piVar5 = __errno_location();
            ngx_log_error_core(3,pnVar7,*piVar5,"getsockopt(SO_TYPE) %V failed",puStack_48);
          }
          goto LAB_0011ff00;
        }
        local_34[0] = 4;
        iVar3 = getsockopt(__optval[-0x37],1,8,__optval + -0x29,local_34);
        if (iVar3 == -1) {
          pnVar7 = local_40->log;
          if (1 < pnVar7->log_level) {
            piVar5 = __errno_location();
            ngx_log_error_core(2,pnVar7,*piVar5,"getsockopt(SO_RCVBUF) %V failed, ignored",
                               puStack_48);
          }
          __optval[-0x29] = 0xffffffff;
        }
        local_34[0] = 4;
        iVar3 = getsockopt(__optval[-0x37],1,7,__optval + -0x28,local_34);
        if (iVar3 == -1) {
          pnVar7 = local_40->log;
          if (1 < pnVar7->log_level) {
            piVar5 = __errno_location();
            ngx_log_error_core(2,pnVar7,*piVar5,"getsockopt(SO_SNDBUF) %V failed, ignored",
                               puStack_48);
          }
          __optval[-0x28] = 0xffffffff;
        }
        local_4c = 0;
        local_34[0] = 4;
        iVar3 = getsockopt(__optval[-0x37],1,0xf,&local_4c,local_34);
        if (iVar3 == -1) {
          pnVar7 = local_40->log;
          if (1 < pnVar7->log_level) {
            piVar5 = __errno_location();
            ngx_log_error_core(2,pnVar7,*piVar5,"getsockopt(SO_REUSEPORT) %V failed, ignored",
                               puStack_48);
          }
        }
        else {
          __optval[-1] = __optval[-1] & 0xffffefff | (uint)(local_4c != 0) << 0xc;
        }
        cycle = local_40;
        if (__optval[-0x2b] == 1) {
          local_34[0] = 4;
          iVar3 = getsockopt(__optval[-0x37],6,0x17,__optval,local_34);
          if (iVar3 == -1) {
            piVar5 = __errno_location();
            iVar3 = *piVar5;
            if (((iVar3 != 0x5c) && (iVar3 != 0x5f)) && (5 < cycle->log->log_level)) {
              ngx_log_error_core(6,cycle->log,iVar3,"getsockopt(TCP_FASTOPEN) %V failed, ignored",
                                 puStack_48);
            }
            *__optval = 0xffffffff;
          }
        }
      }
      uVar6 = uVar6 + 1;
      __optval = __optval + 0x38;
    } while (uVar6 < (cycle->listening).nelts);
  }
  return 0;
}

Assistant:

ngx_int_t
ngx_set_inherited_sockets(ngx_cycle_t *cycle)
{
    size_t                     len;
    ngx_uint_t                 i;
    ngx_listening_t           *ls;
    socklen_t                  olen;
#if (NGX_HAVE_DEFERRED_ACCEPT || NGX_HAVE_TCP_FASTOPEN)
    ngx_err_t                  err;
#endif
#if (NGX_HAVE_DEFERRED_ACCEPT && defined SO_ACCEPTFILTER)
    struct accept_filter_arg   af;
#endif
#if (NGX_HAVE_DEFERRED_ACCEPT && defined TCP_DEFER_ACCEPT)
    int                        timeout;
#endif
#if (NGX_HAVE_REUSEPORT)
    int                        reuseport;
#endif

    ls = cycle->listening.elts;
    for (i = 0; i < cycle->listening.nelts; i++) {

        ls[i].sockaddr = ngx_palloc(cycle->pool, sizeof(ngx_sockaddr_t));
        if (ls[i].sockaddr == NULL) {
            return NGX_ERROR;
        }

        ls[i].socklen = sizeof(ngx_sockaddr_t);
        if (getsockname(ls[i].fd, ls[i].sockaddr, &ls[i].socklen) == -1) {
            ngx_log_error(NGX_LOG_CRIT, cycle->log, ngx_socket_errno,
                          "getsockname() of the inherited "
                          "socket #%d failed", ls[i].fd);
            ls[i].ignore = 1;
            continue;
        }

        if (ls[i].socklen > (socklen_t) sizeof(ngx_sockaddr_t)) {
            ls[i].socklen = sizeof(ngx_sockaddr_t);
        }

        switch (ls[i].sockaddr->sa_family) {

#if (NGX_HAVE_INET6)
        case AF_INET6:
            ls[i].addr_text_max_len = NGX_INET6_ADDRSTRLEN;
            len = NGX_INET6_ADDRSTRLEN + sizeof("[]:65535") - 1;
            break;
#endif

#if (NGX_HAVE_UNIX_DOMAIN)
        case AF_UNIX:
            ls[i].addr_text_max_len = NGX_UNIX_ADDRSTRLEN;
            len = NGX_UNIX_ADDRSTRLEN;
            break;
#endif

        case AF_INET:
            ls[i].addr_text_max_len = NGX_INET_ADDRSTRLEN;
            len = NGX_INET_ADDRSTRLEN + sizeof(":65535") - 1;
            break;

        default:
            ngx_log_error(NGX_LOG_CRIT, cycle->log, ngx_socket_errno,
                          "the inherited socket #%d has "
                          "an unsupported protocol family", ls[i].fd);
            ls[i].ignore = 1;
            continue;
        }

        ls[i].addr_text.data = ngx_pnalloc(cycle->pool, len);
        if (ls[i].addr_text.data == NULL) {
            return NGX_ERROR;
        }

        len = ngx_sock_ntop(ls[i].sockaddr, ls[i].socklen,
                            ls[i].addr_text.data, len, 1);
        if (len == 0) {
            return NGX_ERROR;
        }

        ls[i].addr_text.len = len;

        ls[i].backlog = NGX_LISTEN_BACKLOG;

        olen = sizeof(int);

        if (getsockopt(ls[i].fd, SOL_SOCKET, SO_TYPE, (void *) &ls[i].type,
                       &olen)
            == -1)
        {
            ngx_log_error(NGX_LOG_CRIT, cycle->log, ngx_socket_errno,
                          "getsockopt(SO_TYPE) %V failed", &ls[i].addr_text);
            ls[i].ignore = 1;
            continue;
        }

        olen = sizeof(int);

        if (getsockopt(ls[i].fd, SOL_SOCKET, SO_RCVBUF, (void *) &ls[i].rcvbuf,
                       &olen)
            == -1)
        {
            ngx_log_error(NGX_LOG_ALERT, cycle->log, ngx_socket_errno,
                          "getsockopt(SO_RCVBUF) %V failed, ignored",
                          &ls[i].addr_text);

            ls[i].rcvbuf = -1;
        }

        olen = sizeof(int);

        if (getsockopt(ls[i].fd, SOL_SOCKET, SO_SNDBUF, (void *) &ls[i].sndbuf,
                       &olen)
            == -1)
        {
            ngx_log_error(NGX_LOG_ALERT, cycle->log, ngx_socket_errno,
                          "getsockopt(SO_SNDBUF) %V failed, ignored",
                          &ls[i].addr_text);

            ls[i].sndbuf = -1;
        }

#if 0
        /* SO_SETFIB is currently a set only option */

#if (NGX_HAVE_SETFIB)

        olen = sizeof(int);

        if (getsockopt(ls[i].fd, SOL_SOCKET, SO_SETFIB,
                       (void *) &ls[i].setfib, &olen)
            == -1)
        {
            ngx_log_error(NGX_LOG_ALERT, cycle->log, ngx_socket_errno,
                          "getsockopt(SO_SETFIB) %V failed, ignored",
                          &ls[i].addr_text);

            ls[i].setfib = -1;
        }

#endif
#endif

#if (NGX_HAVE_REUSEPORT)

        reuseport = 0;
        olen = sizeof(int);

        if (getsockopt(ls[i].fd, SOL_SOCKET, SO_REUSEPORT,
                       (void *) &reuseport, &olen)
            == -1)
        {
            ngx_log_error(NGX_LOG_ALERT, cycle->log, ngx_socket_errno,
                          "getsockopt(SO_REUSEPORT) %V failed, ignored",
                          &ls[i].addr_text);

        } else {
            ls[i].reuseport = reuseport ? 1 : 0;
        }

#endif

        if (ls[i].type != SOCK_STREAM) {
            continue;
        }

#if (NGX_HAVE_TCP_FASTOPEN)

        olen = sizeof(int);

        if (getsockopt(ls[i].fd, IPPROTO_TCP, TCP_FASTOPEN,
                       (void *) &ls[i].fastopen, &olen)
            == -1)
        {
            err = ngx_socket_errno;

            if (err != NGX_EOPNOTSUPP && err != NGX_ENOPROTOOPT) {
                ngx_log_error(NGX_LOG_NOTICE, cycle->log, err,
                              "getsockopt(TCP_FASTOPEN) %V failed, ignored",
                              &ls[i].addr_text);
            }

            ls[i].fastopen = -1;
        }

#endif

#if (NGX_HAVE_DEFERRED_ACCEPT && defined SO_ACCEPTFILTER)

        ngx_memzero(&af, sizeof(struct accept_filter_arg));
        olen = sizeof(struct accept_filter_arg);

        if (getsockopt(ls[i].fd, SOL_SOCKET, SO_ACCEPTFILTER, &af, &olen)
            == -1)
        {
            err = ngx_socket_errno;

            if (err == NGX_EINVAL) {
                continue;
            }

            ngx_log_error(NGX_LOG_NOTICE, cycle->log, err,
                          "getsockopt(SO_ACCEPTFILTER) for %V failed, ignored",
                          &ls[i].addr_text);
            continue;
        }

        if (olen < sizeof(struct accept_filter_arg) || af.af_name[0] == '\0') {
            continue;
        }

        ls[i].accept_filter = ngx_palloc(cycle->pool, 16);
        if (ls[i].accept_filter == NULL) {
            return NGX_ERROR;
        }

        (void) ngx_cpystrn((u_char *) ls[i].accept_filter,
                           (u_char *) af.af_name, 16);
#endif

#if (NGX_HAVE_DEFERRED_ACCEPT && defined TCP_DEFER_ACCEPT)

        timeout = 0;
        olen = sizeof(int);

        if (getsockopt(ls[i].fd, IPPROTO_TCP, TCP_DEFER_ACCEPT, &timeout, &olen)
            == -1)
        {
            err = ngx_socket_errno;

            if (err == NGX_EOPNOTSUPP) {
                continue;
            }

            ngx_log_error(NGX_LOG_NOTICE, cycle->log, err,
                          "getsockopt(TCP_DEFER_ACCEPT) for %V failed, ignored",
                          &ls[i].addr_text);
            continue;
        }

        if (olen < sizeof(int) || timeout == 0) {
            continue;
        }

        ls[i].deferred_accept = 1;
#endif
    }

    return NGX_OK;
}